

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayout::setRowVisible(QFormLayout *this,QWidget *widget,bool on)

{
  bool bVar1;
  int index;
  long in_FS_OFFSET;
  ItemRole role;
  int row;
  char local_58 [24];
  char *local_40;
  ItemRole local_38;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QLayoutPrivate::checkWidget(*(QLayoutPrivate **)&(this->super_QLayout).field_0x8,widget);
  if (bVar1) {
    local_34 = -0x55555556;
    local_38 = 0xaaaaaaaa;
    index = (**(code **)(*(long *)&this->super_QLayout + 0xb8))(this,widget);
    getItemPosition(this,index,&local_34,&local_38);
    if (local_34 < 0) {
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_40 = "default";
      QMessageLogger::warning(local_58,"QFormLayout::setRowVisible: Invalid widget");
    }
    else {
      setRowVisible(this,local_34,on);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayout::setRowVisible(QWidget *widget, bool on)
{
    Q_D(QFormLayout);
    if (Q_UNLIKELY(!d->checkWidget(widget)))
        return;

    int row;
    ItemRole role;
    getWidgetPosition(widget, &row, &role);

    if (Q_UNLIKELY(row < 0)) {
        qWarning("QFormLayout::setRowVisible: Invalid widget");
        return;
    }

    setRowVisible(row, on);
}